

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

void xmlNodeDumpOutputInternal(xmlSaveCtxtPtr ctxt,xmlNodePtr cur)

{
  char *buf;
  byte bVar1;
  int iVar2;
  uint uVar3;
  xmlOutputBufferPtr out;
  xmlOutputBufferPtr out_00;
  xmlChar *pxVar4;
  xmlDocPtr pxVar5;
  int iVar6;
  int iVar7;
  xmlChar *pc;
  xmlDocPtr cur_00;
  byte *pbVar8;
  ulong uVar9;
  _xmlNode *p_Var10;
  xmlBufferPtr buf_00;
  xmlChar *pxVar11;
  byte *pc_00;
  int *piVar12;
  _xmlDtd *p_Var13;
  char *pcVar14;
  _xmlDtd *p_Var15;
  _xmlDtd *p_Var16;
  int len;
  long lVar17;
  _xmlNs *cur_01;
  xmlBufPtr buf_01;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  _xmlDtd *local_78;
  int local_6c;
  _xmlDtd *local_68;
  xmlDocPtr local_40;
  
  iVar2 = ctxt->format;
  out = ctxt->buf;
  buf = ctxt->indent;
  local_40 = (xmlDocPtr)0x0;
  pxVar5 = (xmlDocPtr)cur;
LAB_001aefce:
  cur_00 = pxVar5;
  if (cur_00->type == XML_DOCUMENT_FRAG_NODE) goto code_r0x001aefd9;
  switch(cur_00->type) {
  case XML_ELEMENT_NODE:
    if (((cur_00 != (xmlDocPtr)cur) && (ctxt->format == 1)) &&
       (piVar12 = __xmlIndentTreeOutput(), *piVar12 != 0)) {
      iVar6 = ctxt->indent_nr;
      if (ctxt->level < ctxt->indent_nr) {
        iVar6 = ctxt->level;
      }
      xmlOutputBufferWrite(out,iVar6 * ctxt->indent_size,buf);
    }
    if ((ctxt->options & 0x100) == 0) {
      xmlOutputBufferWrite(out,1,"<");
    }
    else {
      smlWriteSemiColonIfNeeded(out);
    }
    if ((*(long *)&cur_00->compression != 0) &&
       (pcVar14 = *(char **)(*(long *)&cur_00->compression + 0x18), pcVar14 != (char *)0x0)) {
      xmlOutputBufferWriteString(out,pcVar14);
      xmlOutputBufferWrite(out,1,":");
    }
    xmlOutputBufferWriteString(out,cur_00->name);
    for (cur_01 = cur_00->oldNs; cur_01 != (xmlNsPtr)0x0; cur_01 = cur_01->next) {
      xmlNsDumpOutput(ctxt->buf,cur_01,ctxt);
    }
    for (p_Var15 = cur_00->extSubset; p_Var15 != (_xmlDtd *)0x0; p_Var15 = (_xmlDtd *)p_Var15->next)
    {
      xmlAttrDumpOutput(ctxt,(xmlAttrPtr)p_Var15);
    }
    p_Var10 = cur_00->children;
    if (p_Var10 == (_xmlNode *)0x0) {
      if ((ctxt->options & 4) == 0) {
        if (ctxt->format == 2) {
          xmlOutputBufferWriteWSNonSig(ctxt,0);
        }
        if ((ctxt->options & 0x100) == 0) {
          iVar6 = 2;
          pcVar14 = "/>";
          goto LAB_001af768;
        }
      }
      else {
        if (ctxt->format == 2) {
          xmlOutputBufferWriteWSNonSig(ctxt,1);
        }
        if ((ctxt->options & 0x100) == 0) {
          xmlOutputBufferWrite(out,3,"></");
          if ((*(long *)&cur_00->compression != 0) &&
             (pcVar14 = *(char **)(*(long *)&cur_00->compression + 0x18), pcVar14 != (char *)0x0)) {
            xmlOutputBufferWriteString(out,pcVar14);
            xmlOutputBufferWrite(out,1,":");
          }
          xmlOutputBufferWriteString(out,cur_00->name);
          if (ctxt->format == 2) {
            xmlOutputBufferWriteWSNonSig(ctxt,0);
          }
          iVar6 = 1;
          pcVar14 = ">";
          goto LAB_001af768;
        }
        pcVar14 = " {}";
LAB_001af909:
        xmlOutputBufferWrite(out,1,pcVar14);
        ctxt->quoted = 0;
      }
      break;
    }
    if (ctxt->format == 1) {
      do {
        if (p_Var10->type - XML_TEXT_NODE < 3) {
          ctxt->format = 0;
          local_40 = cur_00;
          break;
        }
        p_Var10 = p_Var10->next;
      } while (p_Var10 != (_xmlNode *)0x0);
    }
    if (ctxt->format == 2) {
      xmlOutputBufferWriteWSNonSig(ctxt,1);
    }
    if ((ctxt->options & 0x100) == 0) {
      xmlOutputBufferWrite(out,1,">");
    }
    else {
      xmlOutputBufferWrite(out,1," ");
      ctxt->quoted = 0;
    }
    if (((ctxt->options & 0x100) != 0) &&
       ((cur_00->children->type != XML_TEXT_NODE || (cur_00->children->next != (_xmlNode *)0x0)))) {
      xmlOutputBufferWrite(out,1,"{");
    }
    if (ctxt->format == 1) {
      xmlOutputBufferWrite(out,1,"\n");
    }
    if (-1 < ctxt->level) {
      ctxt->level = ctxt->level + 1;
    }
    pxVar5 = (xmlDocPtr)cur_00->children;
    goto LAB_001aefce;
  case XML_ATTRIBUTE_NODE:
    xmlAttrDumpOutput(ctxt,(xmlAttrPtr)cur_00);
    break;
  case XML_TEXT_NODE:
    p_Var15 = cur_00->intSubset;
    if ((ctxt->options & 0x100) != 0) {
      if (p_Var15 == (_xmlDtd *)0x0) {
        cur_00->intSubset = (_xmlDtd *)0x1ff00a;
      }
      if (((cur_00->prev != (_xmlNode *)0x0) && (*(char *)&cur_00->intSubset->_private != '\n')) &&
         (ctxt->quoted == 0)) {
        smlWriteSemiColonIfNeeded(out);
      }
      out_00 = ctxt->buf;
      p_Var15 = cur_00->intSubset;
      iVar6 = xmlStrlen((xmlChar *)p_Var15);
      bVar18 = true;
      if (cur_00->prev == (_xmlNode *)0x0) {
        bVar18 = cur_00->next != (_xmlNode *)0x0;
      }
      p_Var16 = (_xmlDtd *)((long)&p_Var15->_private + (long)iVar6);
      if (bVar18) {
        lVar17 = 0;
        while ((uVar9 = (ulong)*(byte *)((long)&p_Var15->_private + lVar17), uVar9 < 0x21 &&
               ((0x100002600U >> (uVar9 & 0x3f) & 1) != 0))) {
          lVar17 = lVar17 + 1;
        }
        len = (int)lVar17;
        p_Var13 = p_Var15;
        if (len == 0) {
LAB_001af6d2:
          p_Var15 = (_xmlDtd *)((long)&p_Var16[-1].pentities + 7);
          local_68 = p_Var16;
          if (p_Var13 < p_Var15) {
            do {
              if ((0x20 < (ulong)*(byte *)&p_Var15->_private) ||
                 ((0x100002600U >> ((ulong)*(byte *)&p_Var15->_private & 0x3f) & 1) == 0)) break;
              p_Var15 = (_xmlDtd *)((long)&p_Var15[-1].pentities + 7);
            } while (p_Var13 < p_Var15);
            local_68 = (_xmlDtd *)((long)&p_Var15->_private + 1);
          }
          bVar19 = true;
          local_6c = (int)p_Var16 - (int)local_68;
          if (local_6c == 0) {
            local_68 = (_xmlDtd *)0x0;
            p_Var15 = p_Var13;
          }
          else {
            p_Var15 = (_xmlDtd *)xmlStrndup((xmlChar *)p_Var13,iVar6 - local_6c);
            if (p_Var15 == (_xmlDtd *)0x0) {
              p_Var15 = (_xmlDtd *)0x0;
              goto LAB_001af9af;
            }
            p_Var16 = (_xmlDtd *)((long)&p_Var15->_private + (long)(iVar6 - local_6c));
          }
        }
        else {
          iVar7 = xmlOutputBufferWrite(out_00,len,(char *)p_Var15);
          if (iVar7 == -1) {
            local_68 = (_xmlDtd *)0x0;
            local_6c = 0;
LAB_001af9af:
            bVar19 = false;
          }
          else {
            p_Var13 = (_xmlDtd *)((long)&p_Var15->_private + lVar17);
            if (*(xmlChar *)&p_Var13->_private != '\0') {
              iVar6 = iVar6 - len;
              goto LAB_001af6d2;
            }
            local_68 = (_xmlDtd *)0x0;
            local_6c = 0;
            bVar19 = false;
          }
        }
        if (!bVar19) break;
      }
      else {
        local_68 = (_xmlDtd *)0x0;
        local_6c = 0;
      }
      bVar19 = false;
      if (cur_00->prev != (_xmlNode *)0x0) {
        bVar19 = cur_00->prev->type == XML_ENTITY_REF_NODE;
      }
      if ((cur_00->next != (_xmlNode *)0x0) && (cur_00->next->type == XML_ENTITY_REF_NODE)) {
        bVar19 = true;
      }
      if (((bVar19) || (ctxt->quoted != 0)) || (*(char *)&p_Var15->_private == '\0' || bVar18)) {
LAB_001afa0f:
        if (ctxt->quoted == 0) {
          iVar6 = xmlOutputBufferWrite(out_00,1,"\"");
          if (iVar6 == -1) break;
          ctxt->quoted = 1;
        }
        iVar6 = xmlOutputBufferWriteEscape(out_00,(xmlChar *)p_Var15,smlEscapeQuotedString);
        if (iVar6 == -1) break;
        if ((cur_00->next == (_xmlNode *)0x0) || (cur_00->next->type != XML_ENTITY_REF_NODE)) {
          ctxt->quoted = 0;
          iVar6 = xmlOutputBufferWrite(out_00,1,"\"");
          goto LAB_001afa89;
        }
      }
      else {
        bVar19 = p_Var15 >= p_Var16;
        p_Var13 = p_Var15;
        if (p_Var15 < p_Var16) {
          do {
            bVar1 = *(byte *)&p_Var13->_private;
            uVar9 = (ulong)bVar1;
            if (((uVar9 < 0x3f) && ((0x7800004c00000000U >> (uVar9 & 0x3f) & 1) != 0)) ||
               ((bVar1 == 0x7d || (bVar1 == 0x7b)))) {
              uVar9 = 0x20;
            }
            if (((byte)uVar9 < 0x21) && ((0x100002600U >> (uVar9 & 0x3f) & 1) != 0)) break;
            p_Var13 = (_xmlDtd *)xmlNextUTF8Char((xmlChar *)p_Var13);
            bVar19 = p_Var13 >= p_Var16;
          } while (p_Var13 < p_Var16);
          bVar20 = (byte)uVar9 != 0x5c;
        }
        else {
          bVar20 = false;
        }
        if ((!bVar19) || (!bVar20)) goto LAB_001afa0f;
        iVar6 = xmlOutputBufferWriteEscape(out_00,(xmlChar *)p_Var15,smlEscapeRawString);
LAB_001afa89:
        if (iVar6 == -1) break;
      }
      if ((bVar18 && local_68 != (_xmlDtd *)0x0) &&
         (iVar6 = xmlOutputBufferWrite(out_00,local_6c,(char *)local_68), iVar6 != -1)) {
        (*xmlFree)(p_Var15);
      }
      break;
    }
    if (p_Var15 == (_xmlDtd *)0x0) break;
    if ((xmlChar *)cur_00->name != "textnoenc") {
      xmlOutputBufferWriteEscape(out,(xmlChar *)p_Var15,ctxt->escape);
      break;
    }
    goto LAB_001af5af;
  case XML_CDATA_SECTION_NODE:
    local_78 = (_xmlDtd *)0x1fcc5b;
    if ((ctxt->options & 0x100) != 0) {
      smlWriteSemiColonIfNeeded(out);
      local_78 = (_xmlDtd *)0x204493;
    }
    p_Var15 = cur_00->intSubset;
    if ((p_Var15 != (_xmlDtd *)0x0) && (p_Var16 = p_Var15, *(char *)&p_Var15->_private != '\0')) {
      do {
        if (*(char *)&p_Var15->_private == ']') {
          if ((*(char *)((long)&p_Var15->_private + 1) == ']') &&
             (*(char *)((long)&p_Var15->_private + 2) == '>')) {
            p_Var15 = (_xmlDtd *)((long)&p_Var15->_private + 2);
            xmlOutputBufferWriteString(out,(char *)local_78);
            xmlOutputBufferWrite(out,(int)p_Var15 - (int)p_Var16,(char *)p_Var16);
            xmlOutputBufferWriteString(out,"]]>");
            p_Var16 = p_Var15;
          }
        }
        else if (*(char *)&p_Var15->_private == '\0') goto LAB_001af585;
        p_Var15 = (_xmlDtd *)((long)&p_Var15->_private + 1);
      } while( true );
    }
    goto LAB_001af5a0;
  case XML_ENTITY_REF_NODE:
    if (((ctxt->options & 0x100) != 0) && (ctxt->quoted == 0)) {
      xmlOutputBufferWrite(out,1,"\"");
      ctxt->quoted = 1;
    }
    xmlOutputBufferWrite(out,1,"&");
    xmlOutputBufferWriteString(out,cur_00->name);
    xmlOutputBufferWrite(out,1,";");
    if ((ctxt->options & 0x100) != 0) {
      p_Var10 = cur_00->next;
      if (p_Var10 == (_xmlNode *)0x0) {
LAB_001af8fa:
        pcVar14 = "\"";
        goto LAB_001af909;
      }
      if (p_Var10->type != XML_ENTITY_REF_NODE) {
        if (p_Var10->type != XML_TEXT_NODE) goto LAB_001af8fa;
        for (pbVar8 = p_Var10->content; uVar9 = (ulong)*pbVar8, uVar9 < 0x21;
            pbVar8 = xmlNextUTF8Char(pbVar8)) {
          if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
            if (uVar9 == 0) goto LAB_001af8fa;
            break;
          }
        }
      }
    }
    break;
  case XML_PI_NODE:
    if (((cur_00 != (xmlDocPtr)cur) && (ctxt->format == 1)) &&
       (piVar12 = __xmlIndentTreeOutput(), *piVar12 != 0)) {
      iVar6 = ctxt->indent_nr;
      if (ctxt->level < ctxt->indent_nr) {
        iVar6 = ctxt->level;
      }
      xmlOutputBufferWrite(out,iVar6 * ctxt->indent_size,buf);
    }
    p_Var15 = cur_00->intSubset;
    xmlOutputBufferWrite(out,2,"<?");
    xmlOutputBufferWriteString(out,cur_00->name);
    if (p_Var15 == (_xmlDtd *)0x0) {
      if (ctxt->format == 2) {
        xmlOutputBufferWriteWSNonSig(ctxt,0);
      }
    }
    else if (cur_00->intSubset != (_xmlDtd *)0x0) {
      if (ctxt->format == 2) {
        xmlOutputBufferWriteWSNonSig(ctxt,0);
      }
      else {
        xmlOutputBufferWrite(out,1," ");
      }
      xmlOutputBufferWriteString(out,(char *)cur_00->intSubset);
    }
    iVar6 = 2;
    pcVar14 = "?>";
LAB_001af768:
    xmlOutputBufferWrite(out,iVar6,pcVar14);
    break;
  case XML_COMMENT_NODE:
    if (((cur_00 != (xmlDocPtr)cur) && (ctxt->format == 1)) &&
       (piVar12 = __xmlIndentTreeOutput(), *piVar12 != 0)) {
      iVar6 = ctxt->indent_nr;
      if (ctxt->level < ctxt->indent_nr) {
        iVar6 = ctxt->level;
      }
      xmlOutputBufferWrite(out,iVar6 * ctxt->indent_size,buf);
    }
    if (cur_00->intSubset != (_xmlDtd *)0x0) {
      if ((ctxt->options & 0x100) == 0) {
        xmlOutputBufferWrite(out,4,"<!--");
        xmlOutputBufferWriteString(out,(char *)cur_00->intSubset);
        iVar6 = 3;
        pcVar14 = "-->";
      }
      else {
        smlWriteSemiColonIfNeeded(out);
        pxVar11 = xmlStrchr((xmlChar *)cur_00->intSubset,'\n');
        if (pxVar11 == (xmlChar *)0x0) {
          if ((ctxt->format != 0) || ((_xmlDoc *)cur_00->parent == cur_00->doc)) {
LAB_001af8c0:
            xmlOutputBufferWrite(out,1,"#");
            p_Var15 = cur_00->intSubset;
            goto LAB_001af5af;
          }
          p_Var10 = cur_00->next;
          if ((p_Var10 != (_xmlNode *)0x0) && (p_Var10->type == XML_TEXT_NODE)) {
            pbVar8 = p_Var10->content;
            for (pc_00 = pbVar8; uVar9 = (ulong)*pc_00, uVar9 < 0x21; pc_00 = xmlNextUTF8Char(pc_00)
                ) {
              if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) {
                if ((uVar9 == 0) && (*pbVar8 == 10)) goto LAB_001af8c0;
                break;
              }
            }
          }
        }
        xmlOutputBufferWrite(out,3,"#--");
        xmlOutputBufferWriteString(out,(char *)cur_00->intSubset);
        iVar6 = 2;
        pcVar14 = "--";
      }
      goto LAB_001af768;
    }
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    xmlDocContentDumpOutput(ctxt,cur_00);
    break;
  case XML_DTD_NODE:
    xmlDtdDumpOutput(ctxt,(xmlDtdPtr)cur_00);
    break;
  case XML_ELEMENT_DECL:
    if ((ctxt->options & 0x100) == 0) {
      xmlBufDumpElementDecl(out->buffer,(xmlElementPtr)cur_00);
    }
    else {
      buf_01 = out->buffer;
      buf_00 = xmlBufferCreate();
      if (buf_00 != (xmlBufferPtr)0x0) {
        xmlDumpElementDecl(buf_00,(xmlElementPtr)cur_00);
LAB_001af55a:
        pxVar4 = buf_00->content;
        uVar3 = buf_00->use;
        pxVar11 = pxVar4 + (long)(int)uVar3 + -2;
        pxVar11[0] = '\n';
        pxVar11[1] = '0';
        xmlBufAdd(buf_01,pxVar4 + 1,uVar3 - 2);
        xmlBufferFree(buf_00);
      }
    }
    break;
  case XML_ATTRIBUTE_DECL:
    if ((ctxt->options & 0x100) == 0) {
      xmlBufDumpAttributeDecl(out->buffer,(xmlAttributePtr)cur_00);
    }
    else {
      buf_01 = out->buffer;
      buf_00 = xmlBufferCreate();
      if (buf_00 != (xmlBufferPtr)0x0) {
        xmlDumpAttributeDecl(buf_00,(xmlAttributePtr)cur_00);
        goto LAB_001af55a;
      }
    }
    break;
  case XML_ENTITY_DECL:
    if ((ctxt->options & 0x100) == 0) {
      xmlBufDumpEntityDecl(out->buffer,(xmlEntityPtr)cur_00);
    }
    else {
      buf_01 = out->buffer;
      buf_00 = xmlBufferCreate();
      if (buf_00 != (xmlBufferPtr)0x0) {
        xmlDumpEntityDecl(buf_00,(xmlEntityPtr)cur_00);
        goto LAB_001af55a;
      }
    }
    break;
  case XML_NAMESPACE_DECL:
    xmlNsDumpOutput(ctxt->buf,(xmlNsPtr)cur_00,ctxt);
  }
switchD_001af000_caseD_6:
  while( true ) {
    if (cur_00 == (xmlDocPtr)cur) {
      return;
    }
    if ((ctxt->format == 1) && (1 < cur_00->type - XML_XINCLUDE_START)) {
      xmlOutputBufferWrite(out,1,"\n");
    }
    pxVar5 = (xmlDocPtr)cur_00->next;
    if ((xmlDocPtr)cur_00->next != (xmlDocPtr)0x0) break;
    cur_00 = (xmlDocPtr)cur_00->parent;
    if (cur_00 == (xmlDocPtr)0x0) {
      return;
    }
    if (cur_00->type == XML_ELEMENT_NODE) {
      if (0 < ctxt->level) {
        ctxt->level = ctxt->level + -1;
      }
      piVar12 = __xmlIndentTreeOutput();
      if ((*piVar12 != 0) && (ctxt->format == 1)) {
        iVar6 = ctxt->indent_nr;
        if (ctxt->level < ctxt->indent_nr) {
          iVar6 = ctxt->level;
        }
        xmlOutputBufferWrite(out,iVar6 * ctxt->indent_size,buf);
      }
      if (((ctxt->options & 0x100) != 0) &&
         ((cur_00->children->type != XML_TEXT_NODE || (cur_00->children->next != (_xmlNode *)0x0))))
      {
        xmlOutputBufferWrite(out,1,"}");
      }
      if ((ctxt->options & 0x100) == 0) {
        xmlOutputBufferWrite(out,2,"</");
        if ((*(long *)&cur_00->compression != 0) &&
           (pcVar14 = *(char **)(*(long *)&cur_00->compression + 0x18), pcVar14 != (char *)0x0)) {
          xmlOutputBufferWriteString(out,pcVar14);
          xmlOutputBufferWrite(out,1,":");
        }
        xmlOutputBufferWriteString(out,cur_00->name);
        if (ctxt->format == 2) {
          xmlOutputBufferWriteWSNonSig(ctxt,0);
        }
        xmlOutputBufferWrite(out,1,">");
      }
      if (cur_00 == local_40) {
        ctxt->format = iVar2;
        local_40 = (xmlDocPtr)0x0;
      }
    }
  }
  goto LAB_001aefce;
code_r0x001aefd9:
  pxVar5 = (xmlDocPtr)cur_00->children;
  if ((xmlDocPtr)cur_00->children != (xmlDocPtr)0x0) goto LAB_001aefce;
  goto switchD_001af000_caseD_6;
LAB_001af585:
  if (p_Var16 != p_Var15) {
    xmlOutputBufferWriteString(out,(char *)local_78);
    local_78 = p_Var16;
LAB_001af5a0:
    xmlOutputBufferWriteString(out,(char *)local_78);
    p_Var15 = (_xmlDtd *)0x20444a;
LAB_001af5af:
    xmlOutputBufferWriteString(out,(char *)p_Var15);
  }
  goto switchD_001af000_caseD_6;
}

Assistant:

static void
xmlNodeDumpOutputInternal(xmlSaveCtxtPtr ctxt, xmlNodePtr cur) {
    int format = ctxt->format;
    xmlNodePtr tmp, root, unformattedNode = NULL;
    xmlAttrPtr attr;
    xmlChar *start, *end;
    xmlOutputBufferPtr buf;
    DEBUG_CODE(
    const char *pszValue;
    char *c0;
    char *c1;
    switch (cur->type) {
    case XML_TEXT_NODE:
    	pszValue = dbgStr(cur->content);
    	c0 = c1 = "";
    	break;
    case XML_ENTITY_REF_NODE:
    	pszValue = cur->name;
    	c0 = "&";
    	c1 = ";";
    	break;
    default:
    	pszValue = cur->name;
    	c0 = "<";
    	c1 = ">";
    	break;
    }
    );

    DEBUG_ENTER(("xmlNodeDumpOutputInternal(%p, %p [%s]%s%s%s);\n", ctxt, cur, pszXmlElementType[cur->type], c0, pszValue, c1));

    if (cur == NULL) RETURN();
    buf = ctxt->buf;

    root = cur;
    while (1) {
        switch (cur->type) {
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    xmlDocContentDumpOutput(ctxt, (xmlDocPtr) cur);
	    break;

        case XML_DTD_NODE:
            xmlDtdDumpOutput(ctxt, (xmlDtdPtr) cur);
            break;

        case XML_DOCUMENT_FRAG_NODE:
            if (cur->children != NULL) {
                cur = cur->children;
                continue;
            }
	    break;

        case XML_ELEMENT_DECL:
	    if (!(ctxt->options & XML_SAVE_AS_SML)) {	/* XML */
	        xmlBufDumpElementDecl(buf->buffer, (xmlElementPtr) cur);
	    } else {					/* SML */
	        smlBufDumpElementDecl(buf->buffer, (xmlElementPtr) cur);
	    }
            break;

        case XML_ATTRIBUTE_DECL:
	    if (!(ctxt->options & XML_SAVE_AS_SML)) {	/* XML */
	        xmlBufDumpAttributeDecl(buf->buffer, (xmlAttributePtr) cur);
	    } else {					/* SML */
	        smlBufDumpAttributeDecl(buf->buffer, (xmlAttributePtr) cur);
	    }
            break;

        case XML_ENTITY_DECL:
	    if (!(ctxt->options & XML_SAVE_AS_SML)) {	/* XML */
	        xmlBufDumpEntityDecl(buf->buffer, (xmlEntityPtr) cur);
	    } else {					/* SML */
	        smlBufDumpEntityDecl(buf->buffer, (xmlEntityPtr) cur);
	    }
            break;

        case XML_ELEMENT_NODE:
	    if ((cur != root) && (ctxt->format == 1) && (xmlIndentTreeOutput))
		xmlOutputBufferWrite(buf, ctxt->indent_size *
				     (ctxt->level > ctxt->indent_nr ?
				      ctxt->indent_nr : ctxt->level),
				     ctxt->indent);

	    if (!(ctxt->options & XML_SAVE_AS_SML)) {		/* XML */
		xmlOutputBufferWrite(buf, 1, "<");
	    } else {						/* SML */
		smlWriteSemiColonIfNeeded(buf);
	    }
            if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                xmlOutputBufferWrite(buf, 1, ":");
            }
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            if (cur->nsDef)
                xmlNsListDumpOutputCtxt(ctxt, cur->nsDef);
            for (attr = cur->properties; attr != NULL; attr = attr->next)
                xmlAttrDumpOutput(ctxt, attr);

            if (cur->children == NULL) {
                if ((ctxt->options & XML_SAVE_NO_EMPTY) == 0) {
                    if (ctxt->format == 2)
                        xmlOutputBufferWriteWSNonSig(ctxt, 0);
		    if (!(ctxt->options & XML_SAVE_AS_SML))	{	/* XML */
			xmlOutputBufferWrite(buf, 2, "/>");
		    } /* Else nothing to do as empty tags are implicit for SML */
                } else {
                    if (ctxt->format == 2)
                        xmlOutputBufferWriteWSNonSig(ctxt, 1);
		    if (!(ctxt->options & XML_SAVE_AS_SML)) {		/* XML */
			xmlOutputBufferWrite(buf, 3, "></");
			if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
			    xmlOutputBufferWriteString(buf,
				    (const char *)cur->ns->prefix);
			    xmlOutputBufferWrite(buf, 1, ":");
			}
			xmlOutputBufferWriteString(buf, (const char *)cur->name);
			if (ctxt->format == 2)
			    xmlOutputBufferWriteWSNonSig(ctxt, 0);
			xmlOutputBufferWrite(buf, 1, ">");
		    } else {						/* SML */
			xmlOutputBufferWrite(buf, 1, " {}");
			ctxt->quoted = 0;
		    }
                }
            } else {
                if (ctxt->format == 1) {
                    tmp = cur->children;
                    while (tmp != NULL) {
                        if ((tmp->type == XML_TEXT_NODE) ||
                            (tmp->type == XML_CDATA_SECTION_NODE) ||
                            (tmp->type == XML_ENTITY_REF_NODE)) {
                            ctxt->format = 0;
                            unformattedNode = cur;
                            break;
                        }
                        tmp = tmp->next;
                    }
                }
                if (ctxt->format == 2)
                    xmlOutputBufferWriteWSNonSig(ctxt, 1);
		if (!(ctxt->options & XML_SAVE_AS_SML)) {		/* XML */
		    xmlOutputBufferWrite(buf, 1, ">");
		} else {						/* SML */
		    xmlOutputBufferWrite(buf, 1, " ");
		    ctxt->quoted = 0;
		}
		if (ctxt->options & XML_SAVE_AS_SML) {		/* SML */
                    xmlNodePtr child = cur->children;
		    int isOneText = ((child->type == XML_TEXT_NODE) && !child->next);
		    if (!isOneText) xmlOutputBufferWrite(buf, 1, "{");
		}
                if (ctxt->format == 1) xmlOutputBufferWrite(buf, 1, "\n");
                if (ctxt->level >= 0) ctxt->level++;
                cur = cur->children;
                continue;
            }

            break;

        case XML_TEXT_NODE:
	    if (!(ctxt->options & XML_SAVE_AS_SML)) {	/* XML */
		if (cur->content == NULL)
		    break;
		if (cur->name != xmlStringTextNoenc) {
		    xmlOutputBufferWriteEscape(buf, cur->content, ctxt->escape);
		} else {
		    /*
		     * Disable escaping, needed for XSLT
		     */
		    xmlOutputBufferWriteString(buf, (const char *) cur->content);
		}
	    } else {					/* SML */
		if (cur->content == NULL) cur->content = (xmlChar *)"";
		if (cur->prev && (cur->content[0] != '\n') && !ctxt->quoted) {
		    smlWriteSemiColonIfNeeded(buf);
		}
		smlTextNodeDumpOutput(ctxt, cur);
	    }
	    break;

        case XML_PI_NODE:
	    if ((cur != root) && (ctxt->format == 1) && (xmlIndentTreeOutput))
		xmlOutputBufferWrite(buf, ctxt->indent_size *
				     (ctxt->level > ctxt->indent_nr ?
				      ctxt->indent_nr : ctxt->level),
				     ctxt->indent);

            if (cur->content != NULL) {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (cur->content != NULL) {
                    if (ctxt->format == 2)
                        xmlOutputBufferWriteWSNonSig(ctxt, 0);
                    else
                        xmlOutputBufferWrite(buf, 1, " ");
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->content);
                }
                xmlOutputBufferWrite(buf, 2, "?>");
            } else {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (ctxt->format == 2)
                    xmlOutputBufferWriteWSNonSig(ctxt, 0);
                xmlOutputBufferWrite(buf, 2, "?>");
            }
            break;

        case XML_COMMENT_NODE:
	    if ((cur != root) && (ctxt->format == 1) && (xmlIndentTreeOutput))
		xmlOutputBufferWrite(buf, ctxt->indent_size *
				     (ctxt->level > ctxt->indent_nr ?
				      ctxt->indent_nr : ctxt->level),
				     ctxt->indent);

            if (cur->content != NULL) {
		if (!(ctxt->options & XML_SAVE_AS_SML)) {		/* XML */
		    xmlOutputBufferWrite(buf, 4, "<!--");
		    xmlOutputBufferWriteString(buf, (const char *)cur->content);
		    xmlOutputBufferWrite(buf, 3, "-->");
		} else {						/* SML */
		    smlWriteSemiColonIfNeeded(buf);
		    /* If the comment does not fit on a single line */
		    DEBUG_PRINTF(("\\x%02X ... \\x%02X\n", cur->content[0], cur->content[xmlStrlen(cur->content)-1]));
		    if (   xmlStrchr(cur->content, '\n')
			/* Or we're not in formatted mode, and can predict that something will follow on the same line */
			|| (   (!ctxt->format)
			       /* Exception for comments at the top level: xmlDocContentDumpOutput() appends an \n after each top node */
			    && (cur->parent != (struct _xmlNode *)cur->doc)
			    && (/* No other sibling node follows, so that there will be a } on the same line */
				   (!cur->next)
				/* Or if it's followed by anything except blank text beginning with a new line */
				|| (cur->next->type != XML_TEXT_NODE)	/* Not text, so there will be a ; then that next node */
				|| (!xmlStrIsAllBlank(cur->next->content)	/* Non blank text, so the first line will be visible or quoted */
				|| (cur->next->content[0] != '\n'))))	/* Blank text, not quoted, but we must preserve the spaces ahead */
			) {		/* Use the long form */
			xmlOutputBufferWrite(buf, 3, "#--");
			xmlOutputBufferWriteString(buf, (const char *)cur->content);
			xmlOutputBufferWrite(buf, 2, "--");
		    } else {	/* Use the short 1-line form */
			xmlOutputBufferWrite(buf, 1, "#");
			xmlOutputBufferWriteString(buf, (const char *)cur->content);
		    }
		}
            }
            break;

        case XML_ENTITY_REF_NODE:
	    DEBUG_PRINTF(("# Dumping entity &%s;\n", cur->name));
	    if ((ctxt->options & XML_SAVE_AS_SML) && !ctxt->quoted) { /* SML */
		xmlOutputBufferWrite(buf, 1, "\"");
		ctxt->quoted = 1;
	    }
            xmlOutputBufferWrite(buf, 1, "&");
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            xmlOutputBufferWrite(buf, 1, ";");
	    if (ctxt->options & XML_SAVE_AS_SML) {		/* SML */
		if (!cur->next ||
		    (   (cur->next->type != XML_ENTITY_REF_NODE)
		     && (   (cur->next->type != XML_TEXT_NODE)
			 || xmlStrIsAllBlank(cur->next->content)))) {
		    xmlOutputBufferWrite(buf, 1, "\"");
		    ctxt->quoted = 0;
		}
	    }
            break;

        case XML_CDATA_SECTION_NODE: {
	    const char *pszBeginCData;
	    const char *pszEndCData = "]]>";
	    if (!(ctxt->options & XML_SAVE_AS_SML)) {	/* XML */
		pszBeginCData = "<![CDATA[";
	    } else {					/* SML */
		pszBeginCData = "<[[";
		smlWriteSemiColonIfNeeded(buf);
	    }
	    if (cur->content == NULL || *cur->content == '\0') {
		xmlOutputBufferWriteString(buf, pszBeginCData);
		xmlOutputBufferWriteString(buf, pszEndCData);
	    } else {
		start = end = cur->content;
		while (*end != '\0') {
		    if ((*end == ']') && (*(end + 1) == ']') &&
			(*(end + 2) == '>')) {
			end = end + 2;
			xmlOutputBufferWriteString(buf, pszBeginCData);
			xmlOutputBufferWrite(buf, end - start, (const char *)start);
			xmlOutputBufferWriteString(buf, pszEndCData);
			start = end;
		    }
		    end++;
		}
		if (start != end) {
		    xmlOutputBufferWriteString(buf, pszBeginCData);
		    xmlOutputBufferWriteString(buf, (const char *)start);
		    xmlOutputBufferWriteString(buf, pszEndCData);
		}
	    }
            break;
        }
        case XML_ATTRIBUTE_NODE:
            xmlAttrDumpOutput(ctxt, (xmlAttrPtr) cur);
            break;

        case XML_NAMESPACE_DECL:
            xmlNsDumpOutputCtxt(ctxt, (xmlNsPtr) cur);
            break;

        default:
            break;
        }

        while (1) {
            if (cur == root)
                RETURN();
            if ((ctxt->format == 1) &&
                (cur->type != XML_XINCLUDE_START) &&
                (cur->type != XML_XINCLUDE_END))
                xmlOutputBufferWrite(buf, 1, "\n");
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }

            /*
             * The parent should never be NULL here but we want to handle
             * corrupted documents gracefully.
             */
            if (cur->parent == NULL)
                RETURN();
            cur = cur->parent;

            if (cur->type == XML_ELEMENT_NODE) {
                if (ctxt->level > 0) ctxt->level--;
                if ((xmlIndentTreeOutput) && (ctxt->format == 1))
                    xmlOutputBufferWrite(buf, ctxt->indent_size *
                                         (ctxt->level > ctxt->indent_nr ?
                                          ctxt->indent_nr : ctxt->level),
                                         ctxt->indent);
		if (ctxt->options & XML_SAVE_AS_SML) {		/* SML */
                    xmlNodePtr child = cur->children;
		    int isOneText = ((child->type == XML_TEXT_NODE) && !child->next);
		    if (!isOneText) xmlOutputBufferWrite(buf, 1, "}");
		}

		if (!(ctxt->options & XML_SAVE_AS_SML)) {		/* XML */
		    xmlOutputBufferWrite(buf, 2, "</");
		    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
			xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
			xmlOutputBufferWrite(buf, 1, ":");
		    }
	    
		    xmlOutputBufferWriteString(buf, (const char *)cur->name);
		    if (ctxt->format == 2)
			xmlOutputBufferWriteWSNonSig(ctxt, 0);
		    xmlOutputBufferWrite(buf, 1, ">");
		}

                if (cur == unformattedNode) {
                    ctxt->format = format;
                    unformattedNode = NULL;
                }
            }
        }
    }
    RETURN();
}